

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall
leveldb::VersionEdit::AddFile
          (VersionEdit *this,int level,uint64_t file,uint64_t file_size,InternalKey *smallest,
          InternalKey *largest)

{
  pair<int,_leveldb::FileMetaData> local_f0;
  undefined1 local_90 [8];
  FileMetaData f;
  InternalKey *largest_local;
  InternalKey *smallest_local;
  uint64_t file_size_local;
  uint64_t file_local;
  VersionEdit *pVStack_10;
  int level_local;
  VersionEdit *this_local;
  
  f.largest.rep_.field_2._8_8_ = largest;
  file_local._4_4_ = level;
  pVStack_10 = this;
  FileMetaData::FileMetaData((FileMetaData *)local_90);
  f._0_8_ = file;
  f.number = file_size;
  InternalKey::operator=((InternalKey *)&f.file_size,smallest);
  InternalKey::operator=
            ((InternalKey *)((long)&f.smallest.rep_.field_2 + 8),
             (InternalKey *)f.largest.rep_.field_2._8_8_);
  std::make_pair<int&,leveldb::FileMetaData&>
            (&local_f0,(int *)((long)&file_local + 4),(FileMetaData *)local_90);
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::push_back(&this->new_files_,&local_f0);
  std::pair<int,_leveldb::FileMetaData>::~pair(&local_f0);
  FileMetaData::~FileMetaData((FileMetaData *)local_90);
  return;
}

Assistant:

void AddFile(int level, uint64_t file, uint64_t file_size,
               const InternalKey& smallest, const InternalKey& largest) {
    FileMetaData f;
    f.number = file;
    f.file_size = file_size;
    f.smallest = smallest;
    f.largest = largest;
    new_files_.push_back(std::make_pair(level, f));
  }